

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O2

void __thiscall
psy::C::SyntaxTree::newDiagnostic(SyntaxTree *this,DiagnosticDescriptor *descriptor,IndexType tkIdx)

{
  SyntaxToken *pSVar1;
  SyntaxToken local_b8;
  DiagnosticDescriptor local_78;
  
  DiagnosticDescriptor::DiagnosticDescriptor(&local_78,descriptor);
  pSVar1 = tokenAt(this,tkIdx);
  local_b8.field_10 = pSVar1->field_10;
  local_b8.tree_ = pSVar1->tree_;
  local_b8.syntaxK_ = pSVar1->syntaxK_;
  local_b8.byteSize_ = pSVar1->byteSize_;
  local_b8.charSize_ = pSVar1->charSize_;
  local_b8._14_2_ = *(undefined2 *)&pSVar1->field_0xe;
  local_b8.byteOffset_ = pSVar1->byteOffset_;
  local_b8.charOffset_ = pSVar1->charOffset_;
  local_b8.matchingBracket_ = pSVar1->matchingBracket_;
  local_b8.field_7 = pSVar1->field_7;
  local_b8._34_2_ = *(undefined2 *)&pSVar1->field_0x22;
  local_b8.lineno_ = pSVar1->lineno_;
  local_b8.column_ = pSVar1->column_;
  local_b8._44_4_ = *(undefined4 *)&pSVar1->field_0x2c;
  newDiagnostic(this,&local_78,&local_b8);
  SyntaxToken::~SyntaxToken(&local_b8);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_78);
  return;
}

Assistant:

void SyntaxTree::newDiagnostic(DiagnosticDescriptor descriptor,
                               LexedTokens::IndexType tkIdx) const
{
    newDiagnostic(descriptor, tokenAt(tkIdx));
}